

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

qint64 __thiscall QSslSocket::readData(QSslSocket *this,char *data,qint64 maxlen)

{
  char cVar1;
  long lVar2;
  long lVar3;
  qint64 qVar4;
  long in_FS_OFFSET;
  void *local_38;
  char *pcStack_30;
  QMetaTypeInterface *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if ((*(int *)(lVar3 + 0x270) == 0) && (*(char *)(lVar3 + 0x274) == '\0')) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      qVar4 = QIODevice::read(*(char **)(lVar3 + 0x3f8),(longlong)data);
      return qVar4;
    }
    goto LAB_0024eb2b;
  }
  lVar2 = (**(code **)(**(long **)(lVar3 + 0x3f8) + 0xa0))();
  if (lVar2 == 0) {
    if (*(long **)(lVar3 + 0x408) != (long *)0x0) {
      cVar1 = (**(code **)(**(long **)(lVar3 + 0x408) + 0xd0))();
      if (cVar1 != '\0') goto LAB_0024ea80;
    }
    if (*(int *)(lVar3 + 0x260) == 3) goto LAB_0024eaba;
    lVar3 = -(ulong)(maxlen != 0);
  }
  else {
LAB_0024ea80:
    local_38 = (void *)0x0;
    pcStack_30 = (char *)0x0;
    local_28 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"_q_flushReadBuffer",QueuedConnection,1,&local_38,&pcStack_30,
               &local_28);
LAB_0024eaba:
    lVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return lVar3;
  }
LAB_0024eb2b:
  __stack_chk_fail();
}

Assistant:

qint64 QSslSocket::readData(char *data, qint64 maxlen)
{
    Q_D(QSslSocket);
    qint64 readBytes = 0;

    if (d->mode == UnencryptedMode && !d->autoStartHandshake) {
        readBytes = d->plainSocket->read(data, maxlen);
#ifdef QSSLSOCKET_DEBUG
        qCDebug(lcSsl) << "QSslSocket::readData(" << (void *)data << ',' << maxlen << ") =="
                 << readBytes;
#endif
    } else {
        // possibly trigger another transmit() to decrypt more data from the socket
        if (d->plainSocket->bytesAvailable() || d->hasUndecryptedData())
            QMetaObject::invokeMethod(this, "_q_flushReadBuffer", Qt::QueuedConnection);
        else if (d->state != QAbstractSocket::ConnectedState)
            return maxlen ? qint64(-1) : qint64(0);
    }

    return readBytes;
}